

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::anon_unknown_60::
     CompareSortKeys<google::protobuf::FileDescriptor>(FileDescriptor *a,FileDescriptor *b)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  
  lVar1 = **(long **)a;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,lVar1,(*(long **)a)[1] + lVar1);
  lVar1 = **(long **)b;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,lVar1,(*(long **)b)[1] + lVar1);
  uVar3 = local_60;
  if (local_40 < local_60) {
    uVar3 = local_40;
  }
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = memcmp(local_68,local_48,uVar3);
    uVar3 = (ulong)uVar2;
  }
  if ((int)uVar3 == 0) {
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_60 - local_40)) {
      uVar3 = local_60 - local_40;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0;
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return (bool)((byte)(uVar3 >> 0x1f) & 1);
}

Assistant:

bool CompareSortKeys(const T* a, const T* b) {
  return GetSortKey(*a) < GetSortKey(*b);
}